

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitContBind(PrintExpressionContents *this,ContBind *curr)

{
  Type *this_00;
  ostream *stream;
  bool bVar1;
  HeapType HVar2;
  char local_29;
  
  bVar1 = wasm::Type::isContinuation(&curr->cont->type);
  if (bVar1) {
    this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)91>).super_Expression.type;
    bVar1 = wasm::Type::isContinuation(this_00);
    if (bVar1) {
      stream = this->o;
      Colors::outputColorCode(stream,"\x1b[35m");
      Colors::outputColorCode(stream,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(stream,"cont.bind ",10);
      Colors::outputColorCode(stream,"\x1b[0m");
      HVar2 = wasm::Type::getHeapType(&curr->cont->type);
      PrintSExpression::printHeapTypeName(this->parent,HVar2);
      local_29 = ' ';
      std::__ostream_insert<char,std::char_traits<char>>(this->o,&local_29,1);
      HVar2 = wasm::Type::getHeapType(this_00);
      PrintSExpression::printHeapTypeName(this->parent,HVar2);
      return;
    }
  }
  __assert_fail("curr->cont->type.isContinuation() && curr->type.isContinuation()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                ,0x9f9,"void wasm::PrintExpressionContents::visitContBind(ContBind *)");
}

Assistant:

void visitContBind(ContBind* curr) {
    assert(curr->cont->type.isContinuation() && curr->type.isContinuation());
    printMedium(o, "cont.bind ");
    printHeapTypeName(curr->cont->type.getHeapType());
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }